

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedWithCleanupFallback
          (ThreadSafeArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  __pointer_type pAVar1;
  __pointer_type pcVar2;
  CleanupNode *pCVar3;
  SerialArena *this_00;
  ArenaAlign AVar4;
  CleanupNode *pCVar5;
  __pointer_type pAVar6;
  CleanupNode *pCVar7;
  char *pcVar8;
  int line;
  __pointer_type pAVar9;
  ulong n_00;
  void *pvVar10;
  LogMessageFatal local_40;
  
  this_00 = GetSerialArenaFallback(this,n + 0x10);
  AVar4 = ArenaAlignAs(align);
  pcVar2 = (this_00->ptr_)._M_b._M_p;
  if (((ulong)pcVar2 & 7) != 0) {
    __assert_fail("false && \"ArenaAlignDefault::IsAligned(ptr)\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align.h"
                  ,0x90,
                  "auto google::protobuf::internal::ArenaAlign::CeilDefaultAligned(char *)::(anonymous class)::operator()() const"
                 );
  }
  n_00 = n + 7 & 0xfffffffffffffff8;
  pvVar10 = (void *)(-AVar4.align & (ulong)(pcVar2 + (AVar4.align - 1)));
  pAVar1 = (__pointer_type)((long)pvVar10 + n_00);
  if ((__pointer_type)this_00->limit_ < pAVar1) {
    pvVar10 = SerialArena::AllocateAlignedWithCleanupFallback(this_00,n_00,align,destructor);
    return pvVar10;
  }
  (this_00->ptr_)._M_b._M_p = (__pointer_type)pAVar1;
  pCVar5 = (this_00->cleanup_list_).next_;
  if (pCVar5 < (this_00->cleanup_list_).limit_) {
    (this_00->cleanup_list_).next_ = pCVar5 + 1;
    pCVar5->elem = pvVar10;
    pCVar5->destructor = destructor;
  }
  else {
    cleanup::ChunkList::AddFallback(&this_00->cleanup_list_,pvVar10,destructor,this_00);
  }
  pCVar5 = (CleanupNode *)(this_00->cleanup_list_).prefetch_ptr_;
  if ((pCVar5 != (CleanupNode *)0x0) && (pCVar5 < (CleanupNode *)(this_00->cleanup_list_).head_)) {
    pcVar8 = 
    "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
    ;
    line = 0x136;
    goto LAB_00efa579;
  }
  pCVar3 = (this_00->cleanup_list_).next_;
  if (((long)pCVar5 - (long)pCVar3 < 0x181) &&
     (pCVar7 = (this_00->cleanup_list_).limit_, pCVar5 < pCVar7)) {
    if (pCVar3 < pCVar5) {
      pCVar3 = pCVar5;
    }
    pCVar5 = pCVar3;
    if (pCVar5 != (CleanupNode *)0x0) {
      if (pCVar5 + 0x18 < pCVar7) {
        pCVar7 = pCVar5 + 0x18;
      }
      for (; pCVar5 < pCVar7; pCVar5 = pCVar5 + 4) {
      }
      goto LAB_00efa3fe;
    }
  }
  else {
LAB_00efa3fe:
    (this_00->cleanup_list_).prefetch_ptr_ = (char *)pCVar5;
    pcVar8 = (this_00->ptr_)._M_b._M_p;
    if (this_00->limit_ < pcVar8) {
      pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<char_const*,char_const*>
                         (this_00->limit_,pcVar8,"limit_ >= ptr()");
    }
    else {
      pcVar8 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar8 != (Nonnull<const_char_*>)0x0) {
      line = 0xf2;
      goto LAB_00efa579;
    }
    pAVar9 = (__pointer_type)this_00->prefetch_ptr_;
    if ((pAVar9 != (__pointer_type)0x0) && (pAVar9 < (this_00->head_)._M_b._M_p)) {
      pcVar8 = 
      "static_cast<const void*>(prefetch_ptr_) == nullptr || static_cast<const void*>(prefetch_ptr_) >= head()"
      ;
      line = 0x12d;
      goto LAB_00efa579;
    }
    if ((0x400 < (long)pAVar9 - (long)pAVar1) ||
       (pAVar6 = (__pointer_type)this_00->limit_, pAVar6 <= pAVar9)) {
LAB_00efa448:
      this_00->prefetch_ptr_ = (char *)pAVar9;
      return pvVar10;
    }
    if (pAVar1 < pAVar9) {
      pAVar1 = pAVar9;
    }
    pAVar9 = pAVar1;
    if (pAVar9 != (__pointer_type)0x0) {
      if (pAVar9 + 0x40 < pAVar6) {
        pAVar6 = pAVar9 + 0x40;
      }
      for (; pAVar9 < pAVar6; pAVar9 = pAVar9 + 4) {
      }
      goto LAB_00efa448;
    }
  }
  pcVar8 = "prefetch_ptr != nullptr";
  line = 0x122;
LAB_00efa579:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
             ,line,pcVar8);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
}

Assistant:

PROTOBUF_NOINLINE
void* ThreadSafeArena::AllocateAlignedWithCleanupFallback(
    size_t n, size_t align, void (*destructor)(void*)) {
  return GetSerialArenaFallback(n + kMaxCleanupNodeSize)
      ->AllocateAlignedWithCleanup(n, align, destructor);
}